

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict
sexp_bit_set_p(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict i,sexp_conflict x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_sint_t rem;
  sexp_sint_t pos;
  ulong local_50;
  ulong local_48;
  sexp_conflict local_8;
  
  if ((in_RCX & 1) == 1) {
    auVar1._8_8_ = (long)in_RCX >> 0x3f;
    auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
    uVar5 = SUB168(auVar1 / SEXT816(2),0);
    if ((long)uVar5 < 0) {
      local_8 = (sexp_conflict)
                sexp_xtype_exception(in_RDI,in_RSI,"index must be non-negative",in_RCX);
    }
    else if (((ulong)in_R8 & 1) == 1) {
      if (uVar5 < 0x40) {
        auVar2._8_8_ = (long)in_R8 >> 0x3f;
        auVar2._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_48 = SUB168(auVar2 / SEXT816(2),0) & 1L << (SUB161(auVar1 / SEXT816(2),0) & 0x3f);
      }
      else {
        auVar3._8_8_ = (long)in_R8 >> 0x3f;
        auVar3._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        local_48 = (ulong)(int)(uint)(SUB168(auVar3 / SEXT816(2),0) < 0);
      }
      local_8 = (sexp_conflict)0x3e;
      if (local_48 != 0) {
        local_8 = (sexp_conflict)0x13e;
      }
    }
    else if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
      auVar4._8_8_ = (long)in_RCX >> 0x3f;
      auVar4._0_8_ = in_RCX & 0xfffffffffffffffe;
      if ((long)(uVar5 >> 6) < *(long *)(in_R8 + 4)) {
        local_50 = *(ulong *)(in_R8 + (uVar5 >> 6) * 2 + 6) &
                   1L << (SUB161(auVar4 / SEXT816(2),0) & 0x3f);
      }
      else {
        local_50 = (ulong)(int)(uint)((char)in_R8[2] < '\0');
      }
      local_8 = (sexp_conflict)0x3e;
      if (local_50 != 0) {
        local_8 = (sexp_conflict)0x13e;
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_bit_set_p (sexp ctx, sexp self, sexp_sint_t n, sexp i, sexp x) {
  sexp_sint_t pos;
#if SEXP_USE_BIGNUMS
  sexp_sint_t rem;
#endif
  if (! sexp_fixnump(i))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, i);
  pos = sexp_unbox_fixnum(i);
  if (pos < 0)
    return sexp_xtype_exception(ctx, self, "index must be non-negative", i);
  if (sexp_fixnump(x)) {
    return sexp_make_boolean((pos < sizeof(sexp_uint_t)*CHAR_BIT)
                             ? (sexp_unbox_fixnum(x) & ((sexp_uint_t)1<<pos))
                             : sexp_unbox_fixnum(x) < 0);
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    pos /= (sizeof(sexp_uint_t)*CHAR_BIT);
    rem = (sexp_unbox_fixnum(i) - pos*sizeof(sexp_uint_t)*CHAR_BIT);
    return sexp_make_boolean((pos < (sexp_sint_t)sexp_bignum_length(x))
                             ? (sexp_bignum_data(x)[pos] & ((sexp_uint_t)1<<rem))
                             : sexp_bignum_sign(x) < 0);
#endif
  } else {
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
}